

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

void __thiscall jrtplib::RTPSources::ClearSourceList(RTPSources *this)

{
  RTPInternalSourceData *obj;
  bool bVar1;
  RTPInternalSourceData **ppRVar2;
  RTPMemoryManager *mgr;
  RTPInternalSourceData *sourcedata;
  RTPSources *this_local;
  
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::GotoFirstElement(&this->sourcelist);
  while( true ) {
    bVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
            ::HasCurrentElement(&this->sourcelist);
    if (!bVar1) break;
    ppRVar2 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    obj = *ppRVar2;
    mgr = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPDelete<jrtplib::RTPInternalSourceData>(obj,mgr);
    RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
    ::GotoNextElement(&this->sourcelist);
  }
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
  ::Clear(&this->sourcelist);
  this->owndata = (RTPInternalSourceData *)0x0;
  this->totalcount = 0;
  this->sendercount = 0;
  this->activecount = 0;
  return;
}

Assistant:

void RTPSources::ClearSourceList()
{
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *sourcedata;

		sourcedata = sourcelist.GetCurrentElement();
		RTPDelete(sourcedata,GetMemoryManager());
		sourcelist.GotoNextElement();
	}
	sourcelist.Clear();
	owndata = 0;
	totalcount = 0;
	sendercount = 0;
	activecount = 0;
}